

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBytecodeGenerator::ExitEvalStackScope(WasmBytecodeGenerator *this,BlockInfo *blockInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  WasmCompilationException *this_00;
  char16 local_428 [4];
  char16 buf [512];
  EmitInfo local_20;
  EmitInfo info;
  BlockInfo *blockInfo_local;
  WasmBytecodeGenerator *this_local;
  
  info = (EmitInfo)blockInfo;
  bVar2 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Empty
                    (&this->m_evalStack);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x842,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_20 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
                       (&this->m_evalStack);
  do {
    if (local_20.type != Any) {
      if (local_20.type == Limit) {
        return;
      }
      JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Push
                (&this->m_evalStack,&local_20);
      memset(local_428,0,0x400);
      WriteTypeStackToString(this,local_428,0x200);
      this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_00,L"Expected stack to be empty, but has %s",local_428);
      __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                  WasmCompilationException::~WasmCompilationException);
    }
    bVar2 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Empty
                      (&this->m_evalStack);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x847,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    buf._1016_8_ = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::
                   Pop(&this->m_evalStack);
    local_20 = (EmitInfo)buf._1016_8_;
  } while( true );
}

Assistant:

void WasmBytecodeGenerator::ExitEvalStackScope(const BlockInfo* blockInfo)
{
    Assert(!m_evalStack.Empty());
    EmitInfo info = m_evalStack.Pop();
    // It is possible to have unconsumed Any type left on the stack, simply remove them
    while (info.type == WasmTypes::Any)
    {
        Assert(!m_evalStack.Empty());
        info = m_evalStack.Pop();
    }
    if (info.type != WasmTypes::Limit)
    {
        // Put info back on stack so we can write it to string
        m_evalStack.Push(info);
        char16 buf[512] = { 0 };
        WriteTypeStackToString(buf, 512);
        throw WasmCompilationException(_u("Expected stack to be empty, but has %s"), buf);
    }
}